

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::ScopeInfo_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::FindEntryWithKey<unsigned_int>
          (BaseDictionary<unsigned_int,_Js::ScopeInfo_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,uint *key)

{
  Type piVar1;
  uint uVar2;
  int *piVar3;
  Type this_00;
  int iVar4;
  long lVar5;
  
  piVar1 = this->buckets;
  if (piVar1 == (Type)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = GetBucket(this,*key * 2 + 1);
    piVar3 = piVar1 + uVar2;
    uVar2 = 0;
    while( true ) {
      iVar4 = *piVar3;
      lVar5 = (long)iVar4;
      if (lVar5 < 0) break;
      if (this->entries[lVar5].
          super_DefaultHashedEntry<unsigned_int,_Js::ScopeInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<unsigned_int,_Js::ScopeInfo_*>.
          super_ValueEntry<Js::ScopeInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ScopeInfo_*>_>
          .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ScopeInfo_*>.key == *key) {
        this_00 = this->stats;
        goto LAB_007c8d7c;
      }
      uVar2 = uVar2 + 1;
      piVar3 = &this->entries[lVar5].
                super_DefaultHashedEntry<unsigned_int,_Js::ScopeInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_int,_Js::ScopeInfo_*>.
                super_ValueEntry<Js::ScopeInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ScopeInfo_*>_>
                .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ScopeInfo_*>.next;
    }
  }
  this_00 = this->stats;
  iVar4 = -1;
LAB_007c8d7c:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar2);
  }
  return iVar4;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }